

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::OutputSampleMean
          (aggreports *this,int handle,int eptype,int eptype_tvar,
          offset_in_OutLosses_to_subr GetOutLoss)

{
  int eptype_00;
  bool bVar1;
  int eptype_tvar_00;
  int in_R9D;
  vector<int,_std::allocator<int>_> fileIDs;
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  if (this->outputFlags_[handle] != false) {
    GetFileIDs((vector<int,_std::allocator<int>_> *)&local_40,this,handle,0);
    bVar1 = this->ordFlag_;
    eptype_00 = ((uint)bVar1 + (uint)bVar1 ^ 2) + (uint)bVar1 * 4;
    eptype_tvar_00 = eptype * (uint)bVar1;
    if ((this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      SampleMean(this,(vector<int,_std::allocator<int>_> *)&local_40,GetOutLoss,in_R9D,eptype_00,
                 eptype_tvar_00);
    }
    else {
      SampleMeanWithWeighting
                (this,(vector<int,_std::allocator<int>_> *)&local_40,GetOutLoss,in_R9D,eptype_00,
                 eptype_tvar_00);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  }
  return;
}

Assistant:

void aggreports::OutputSampleMean(const int handle, int eptype,
				  const int eptype_tvar,
				  OASIS_FLOAT (OutLosses::*GetOutLoss)()) {

  if (outputFlags_[handle] == false) return;

  std::vector<int> fileIDs = GetFileIDs(handle);

  // EPCalc = MEANSAMPLE for ORD output
  // EPCalc = 2 for legacy output
  int epcalc = ordFlag_ * MEANSAMPLE + !ordFlag_ * 2;
  // EPType doubles as ensemble ID for legacy output
  eptype *= ordFlag_;   // Set to default value 0 in legacy output

  if (periodstoweighting_.size() == 0) {
    SampleMean(fileIDs, GetOutLoss, epcalc, eptype, eptype_tvar);
    return;
  }

  SampleMeanWithWeighting(fileIDs, GetOutLoss, epcalc, eptype, eptype_tvar);

}